

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QGesture*,QPointer<QWidget>>::emplace_helper<QPointer<QWidget>>
          (QHash<QGesture*,QPointer<QWidget>> *this,QGesture **key,QPointer<QWidget> *args)

{
  QObject *pQVar1;
  piter pVar2;
  Node<QGesture*,QPointer<QWidget>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>>::findOrInsert<QGesture*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> **)this,key);
  this_00 = (Node<QGesture*,QPointer<QWidget>> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(QGesture **)this_00 = *key;
    pQVar1 = (args->wp).value;
    *(Data **)(this_00 + 8) = (args->wp).d;
    *(QObject **)(this_00 + 0x10) = pQVar1;
    (args->wp).d = (Data *)0x0;
    (args->wp).value = (QObject *)0x0;
  }
  else {
    QHashPrivate::Node<QGesture*,QPointer<QWidget>>::emplaceValue<QPointer<QWidget>>(this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }